

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

int disarm_shooting_trap(trap *ttmp,int otyp,schar dx,schar dy)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  uVar2 = try_disarm(ttmp,'\0',dx,dy);
  if (1 < uVar2) {
    pline("You disarm %s trap.",the_your[(byte)ttmp->field_0x8 >> 7]);
    uVar2 = mt_random();
    lVar6 = (long)u.uluck;
    lVar5 = (long)u.moreluck;
    iVar4 = (int)(lVar5 + lVar6);
    if (otyp == 8) {
      uVar2 = uVar2 % 10;
      if ((iVar4 != 0) &&
         (uVar3 = mt_random(), SUB168(ZEXT416(uVar3) % SEXT816(0x32 - (lVar5 + lVar6)),0) != 0)) {
        iVar4 = (int)u.moreluck + (int)u.uluck;
        if (-6 < iVar4) {
          sVar1 = (short)((uint)(iVar4 * 0x5556) >> 0x10);
          iVar4 = (int)(short)(sVar1 - (sVar1 >> 0xf));
        }
        uVar2 = uVar2 - iVar4;
        if ((int)uVar2 < 0) {
          uVar2 = 0;
        }
        else if (8 < uVar2) {
          uVar2 = 9;
        }
      }
      iVar4 = 10 - uVar2;
      otyp = 8;
    }
    else {
      uVar2 = uVar2 % 0x32;
      if (iVar4 != 0) {
        uVar3 = mt_random();
        if (((SUB168(ZEXT416(uVar3) % SEXT816((long)(0x32 - iVar4)),0) != 0) &&
            (uVar3 = uVar2 - ((int)u.moreluck + (int)u.uluck), uVar2 = 0, -1 < (int)uVar3)) &&
           (uVar2 = 0x31, uVar3 < 0x31)) {
          uVar2 = uVar3;
        }
      }
      iVar4 = 0x32 - uVar2;
    }
    cnv_trap_obj(otyp,iVar4,ttmp);
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

static int disarm_shooting_trap(struct trap *ttmp, int otyp, schar dx, schar dy)
{
	int fails = try_disarm(ttmp, FALSE, dx, dy);

	if (fails < 2)
	    return fails;
	pline("You disarm %s trap.", the_your[ttmp->madeby_u]);
	cnv_trap_obj(otyp, otyp == SHURIKEN ? 10-rnl(10) : 50-rnl(50), ttmp);
	return 1;
}